

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall
QListModeViewBase::scrollContentsBy(QListModeViewBase *this,int dx,int dy,bool scrollElasticBand)

{
  long lVar1;
  bool bVar2;
  ScrollMode SVar3;
  ScrollMode SVar4;
  Flow FVar5;
  int in_EDX;
  int in_ESI;
  QCommonListViewBase *in_RDI;
  long in_FS_OFFSET;
  int previousCoordinate_3;
  int currentCoordinate_3;
  int previousValue_3;
  int currentValue_3;
  int previousCoordinate_2;
  int currentCoordinate_2;
  int previousValue_2;
  int currentValue_2;
  int previousCoordinate_1;
  int currentCoordinate_1;
  int previousValue_1;
  int currentValue_1;
  int previousCoordinate;
  int currentCoordinate;
  int previousValue;
  int currentValue;
  bool horizontal;
  bool vertical;
  int max_1;
  int max;
  int horizontalValue;
  int verticalValue;
  qsizetype in_stack_ffffffffffffff28;
  QCommonListViewBase *i;
  QCommonListViewBase *in_stack_ffffffffffffff30;
  undefined1 uVar6;
  QCommonListViewBase *in_stack_ffffffffffffff38;
  QCommonListViewBase *in_stack_ffffffffffffff40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QCommonListViewBase::verticalScrollBar((QCommonListViewBase *)0x882a9c);
  QAbstractSlider::value((QAbstractSlider *)in_stack_ffffffffffffff30);
  QCommonListViewBase::horizontalScrollBar((QCommonListViewBase *)0x882ab5);
  QAbstractSlider::value((QAbstractSlider *)in_stack_ffffffffffffff30);
  SVar3 = QCommonListViewBase::verticalScrollMode((QCommonListViewBase *)0x882ace);
  SVar4 = QCommonListViewBase::horizontalScrollMode((QCommonListViewBase *)0x882ae4);
  bVar2 = QCommonListViewBase::isWrapping((QCommonListViewBase *)0x882afa);
  if (bVar2) {
    bVar2 = QList<int>::isEmpty((QList<int> *)0x882b11);
    if (bVar2) goto LAB_00882fd2;
    QList<int>::size((QList<int> *)&in_RDI[1].contentsSize);
    if (((SVar4 == ScrollPerItem) &&
        (FVar5 = QCommonListViewBase::flow(in_RDI), FVar5 == TopToBottom)) && (in_ESI != 0)) {
      qBound<int>((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                  (int *)in_stack_ffffffffffffff30);
      qBound<int>((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                  (int *)in_stack_ffffffffffffff30);
      QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      QCommonListViewBase::spacing((QCommonListViewBase *)0x882bf2);
      QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      uVar6 = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
      QCommonListViewBase::spacing((QCommonListViewBase *)0x882c21);
    }
    else {
      if (((SVar3 == ScrollPerItem) &&
          (FVar5 = QCommonListViewBase::flow(in_RDI), FVar5 == LeftToRight)) && (in_EDX != 0)) {
        qBound<int>((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                    (int *)in_stack_ffffffffffffff30);
        qBound<int>((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                    (int *)in_stack_ffffffffffffff30);
        QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        QCommonListViewBase::spacing((QCommonListViewBase *)0x882cfe);
        QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        QCommonListViewBase::spacing((QCommonListViewBase *)0x882d2d);
      }
      uVar6 = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
    }
  }
  else {
    bVar2 = QList<int>::isEmpty((QList<int> *)0x882d5d);
    if (bVar2) goto LAB_00882fd2;
    QList<int>::size((QList<int> *)&in_RDI[3].qq);
    if (((SVar3 == ScrollPerItem) &&
        (FVar5 = QCommonListViewBase::flow(in_RDI), FVar5 == TopToBottom)) && (in_EDX != 0)) {
      qBound<int>((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                  (int *)in_stack_ffffffffffffff30);
      qBound<int>((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                  (int *)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff38 = in_RDI + 1;
      QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff40 = in_RDI + 1;
      QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      uVar6 = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
    }
    else {
      if (((SVar4 == ScrollPerItem) &&
          (FVar5 = QCommonListViewBase::flow(in_RDI), FVar5 == LeftToRight)) && (in_ESI != 0)) {
        qBound<int>((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                    (int *)in_stack_ffffffffffffff30);
        qBound<int>((int *)in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,
                    (int *)in_stack_ffffffffffffff30);
        i = in_RDI + 1;
        QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,(qsizetype)i);
        QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,(qsizetype)i);
        in_stack_ffffffffffffff30 = in_RDI + 1;
        QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,(qsizetype)i);
        QList<int>::at((QList<int> *)in_stack_ffffffffffffff30,(qsizetype)i);
      }
      uVar6 = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
    }
  }
  QCommonListViewBase::scrollContentsBy
            (in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             (int)in_stack_ffffffffffffff38,(bool)uVar6);
LAB_00882fd2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListModeViewBase::scrollContentsBy(int dx, int dy, bool scrollElasticBand)
{
    // ### reorder this logic
    const int verticalValue = verticalScrollBar()->value();
    const int horizontalValue = horizontalScrollBar()->value();
    const bool vertical = (verticalScrollMode() == QAbstractItemView::ScrollPerItem);
    const bool horizontal = (horizontalScrollMode() == QAbstractItemView::ScrollPerItem);

    if (isWrapping()) {
        if (segmentPositions.isEmpty())
            return;
        const int max = segmentPositions.size() - 1;
        if (horizontal && flow() == QListView::TopToBottom && dx != 0) {
            int currentValue = qBound(0, horizontalValue, max);
            int previousValue = qBound(0, currentValue + dx, max);
            int currentCoordinate = segmentPositions.at(currentValue) - spacing();
            int previousCoordinate = segmentPositions.at(previousValue) - spacing();
            dx = previousCoordinate - currentCoordinate;
        } else if (vertical && flow() == QListView::LeftToRight && dy != 0) {
            int currentValue = qBound(0, verticalValue, max);
            int previousValue = qBound(0, currentValue + dy, max);
            int currentCoordinate = segmentPositions.at(currentValue) - spacing();
            int previousCoordinate = segmentPositions.at(previousValue) - spacing();
            dy = previousCoordinate - currentCoordinate;
        }
    } else {
        if (flowPositions.isEmpty())
            return;
        const int max = scrollValueMap.size() - 1;
        if (vertical && flow() == QListView::TopToBottom && dy != 0) {
            int currentValue = qBound(0, verticalValue, max);
            int previousValue = qBound(0, currentValue + dy, max);
            int currentCoordinate = flowPositions.at(scrollValueMap.at(currentValue));
            int previousCoordinate = flowPositions.at(scrollValueMap.at(previousValue));
            dy = previousCoordinate - currentCoordinate;
        } else if (horizontal && flow() == QListView::LeftToRight && dx != 0) {
            int currentValue = qBound(0, horizontalValue, max);
            int previousValue = qBound(0, currentValue + dx, max);
            int currentCoordinate = flowPositions.at(scrollValueMap.at(currentValue));
            int previousCoordinate = flowPositions.at(scrollValueMap.at(previousValue));
            dx = previousCoordinate - currentCoordinate;
        }
    }
    QCommonListViewBase::scrollContentsBy(dx, dy, scrollElasticBand);
}